

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_rc_Ptr.h
# Opt level: O2

int __thiscall
axl::rc::
Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>::Hdr>
::copy(Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>::Hdr>
       *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int in_EAX;
  size_t sVar1;
  RefCount *this_00;
  
  this->m_p = (Hdr *)dst;
  this_00 = this->m_refCount;
  if (this_00 != (RefCount *)src) {
    if (src != (EVP_PKEY_CTX *)0x0) {
      LOCK();
      *(int *)(src + 0x10) = *(int *)(src + 0x10) + 1;
      UNLOCK();
      this_00 = this->m_refCount;
    }
    if (this_00 != (RefCount *)0x0) {
      sVar1 = RefCount::release(this_00);
      in_EAX = (int)sVar1;
    }
    this->m_refCount = (RefCount *)src;
  }
  return in_EAX;
}

Assistant:

void
	copy(
		T* p,
		RefCount* refCount
	) {
		m_p = p;

		if (m_refCount == refCount)
			return;

		if (refCount)
			refCount->addRef();

		if (m_refCount)
			m_refCount->release();

		m_refCount = refCount;
	}